

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_code.hpp
# Opt level: O3

bool __thiscall
boost::system::error_category::std_category::equivalent
          (std_category *this,int code,error_condition *condition)

{
  error_category *peVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  error_category *peVar5;
  long lVar6;
  error_category *extraout_RDX;
  ulong uVar8;
  error_code bc;
  error_condition bn;
  uint local_50 [2];
  error_category *local_48;
  int local_40;
  long *local_38;
  _func_int **pp_Var7;
  
  uVar8 = (ulong)(uint)code;
  iVar3 = (**(code **)(*(long *)this + 0x28))();
  peVar1 = condition->_M_cat;
  iVar4 = condition->_M_value;
  if (extraout_RDX == peVar1 && iVar3 == iVar4) {
    return true;
  }
  peVar5 = (error_category *)std::_V2::generic_category();
  local_50[0] = code;
  if (peVar1 != peVar5) {
    if (generic_category()::generic_category_const == '\0') {
      equivalent();
    }
    if (peVar1 != (error_category *)&DAT_00105148) {
      lVar6 = __dynamic_cast(condition->_M_cat,&std::_V2::error_category::typeinfo,&typeinfo,0);
      if (lVar6 == 0) {
        return false;
      }
      local_48 = this->pc_;
      local_38 = *(long **)(lVar6 + 8);
      pp_Var7 = local_48->_vptr_error_category;
      local_40 = condition->_M_value;
      goto LAB_00102d36;
    }
    iVar4 = condition->_M_value;
  }
  local_48 = this->pc_;
  if (generic_category()::generic_category_const == '\0') {
    equivalent();
  }
  local_38 = &generic_category()::generic_category_const;
  uVar8 = (ulong)local_50[0];
  pp_Var7 = local_48->_vptr_error_category;
  local_40 = iVar4;
LAB_00102d36:
  iVar4 = (*pp_Var7[5])(local_48,uVar8);
  uVar2 = 1;
  if ((char)iVar4 == '\0') {
    uVar2 = (**(code **)(*local_38 + 0x30))(local_38,local_50,local_40);
  }
  return (bool)uVar2;
}

Assistant:

inline bool error_category::std_category::equivalent( int code,
      const std::error_condition & condition ) const BOOST_NOEXCEPT
    {
      if( default_error_condition( code ) == condition )
      {
        return true;
      }
      else if( condition.category() == std::generic_category()
        || condition.category() == boost::system::generic_category() )
      {
        boost::system::error_code bc( code, *pc_ );
        boost::system::error_condition bn( condition.value(),
          boost::system::generic_category() );

        return bc == bn;
      }
#ifndef BOOST_NO_RTTI
      else if( std_category const* pc2 = dynamic_cast< std_category const* >(
        &condition.category() ) )
      {
        boost::system::error_code bc( code, *pc_ );
        boost::system::error_condition bn( condition.value(), *pc2->pc_ );

        return bc == bn;
      }
#endif
      else
      {
        return false;
      }
    }